

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffimem(fitsfile **fptr,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  int *piVar1;
  size_t sVar2;
  size_t *psVar3;
  int *status_00;
  int iVar4;
  fitsfile *fptr_00;
  FITSfile *pFVar5;
  LONGLONG *pLVar6;
  char *pcVar7;
  long lVar8;
  fitsfile **ppfVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  fitsdriver *__s1;
  int iVar14;
  int iVar15;
  int iVar16;
  int handle;
  char urltype [20];
  int local_6c;
  fitsfile **local_68;
  _func_void_ptr_void_ptr_size_t *local_60;
  size_t *local_58;
  int *local_50;
  char local_48 [24];
  
  if (0 < *status) {
    return *status;
  }
  *fptr = (fitsfile *)0x0;
  if (need_to_initialize != 0) {
    iVar4 = fits_init_cfitsio();
    *status = iVar4;
  }
  iVar4 = *status;
  if (iVar4 < 1) {
    builtin_strncpy(local_48,"memkeep://",0xb);
    uVar13 = (ulong)(uint)no_of_drivers;
    __s1 = driverTable + uVar13;
    local_68 = fptr;
    local_60 = mem_realloc;
    local_58 = buffsize;
    local_50 = status;
    do {
      __s1 = __s1 + -1;
      uVar11 = (uint)uVar13;
      if ((int)uVar11 < 1) {
        iVar4 = 0x7c;
        uVar12 = uVar11;
        goto LAB_0011e450;
      }
      iVar4 = strcmp(__s1->prefix,local_48);
      uVar13 = (ulong)(uVar11 - 1);
    } while (iVar4 != 0);
    iVar4 = 0;
    uVar12 = uVar11 - 1;
LAB_0011e450:
    status_00 = local_50;
    psVar3 = local_58;
    *local_50 = iVar4;
    if ((int)uVar11 < 1) {
      pcVar10 = "could not find driver for pre-existing memory file: (ffimem)";
    }
    else {
      iVar4 = mem_openmem(buffptr,local_58,deltasize,local_60,&local_6c);
      *status_00 = iVar4;
      if (iVar4 < 1) {
        fptr_00 = (fitsfile *)calloc(1,0x10);
        *local_68 = fptr_00;
        if (fptr_00 == (fitsfile *)0x0) {
          (*driverTable[(int)uVar12].close)(local_6c);
          ffpmsg("failed to allocate structure for memory file: (ffimem)");
        }
        else {
          pFVar5 = (FITSfile *)calloc(1,0x7e8);
          fptr_00->Fptr = pFVar5;
          if (pFVar5 == (FITSfile *)0x0) {
            (*driverTable[(int)uVar12].close)(local_6c);
            ffpmsg("failed to allocate structure for memory file: (ffimem)");
            ppfVar9 = local_68;
          }
          else {
            pcVar10 = (char *)malloc(0x20);
            pFVar5->filename = pcVar10;
            if (pcVar10 == (char *)0x0) {
              (*driverTable[(int)uVar12].close)(local_6c);
              ffpmsg("failed to allocate memory for filename: (ffimem)");
              ppfVar9 = local_68;
            }
            else {
              pLVar6 = (LONGLONG *)calloc(0x3e9,8);
              pFVar5->headstart = pLVar6;
              if (pLVar6 == (LONGLONG *)0x0) {
                (*driverTable[(int)uVar12].close)(local_6c);
                ffpmsg("failed to allocate memory for headstart array: (ffimem)");
                ppfVar9 = local_68;
              }
              else {
                pcVar7 = (char *)calloc(0x28,0xb40);
                pFVar5->iobuffer = pcVar7;
                if (pcVar7 != (char *)0x0) {
                  memset(pFVar5->bufrecnum,0xff,0x140);
                  iVar4 = 0;
                  iVar14 = 1;
                  iVar15 = 2;
                  iVar16 = 3;
                  lVar8 = 0x1d2;
                  do {
                    piVar1 = &pFVar5->filehandle + lVar8;
                    *piVar1 = iVar4;
                    piVar1[1] = iVar14;
                    piVar1[2] = iVar15;
                    piVar1[3] = iVar16;
                    iVar4 = iVar4 + 4;
                    iVar14 = iVar14 + 4;
                    iVar15 = iVar15 + 4;
                    iVar16 = iVar16 + 4;
                    lVar8 = lVar8 + 4;
                  } while (lVar8 != 0x1fa);
                  pFVar5->MAXHDU = 1000;
                  pFVar5->filehandle = local_6c;
                  pFVar5->driver = uVar12;
                  builtin_strncpy(pcVar10,"memfile",8);
                  sVar2 = *psVar3;
                  pFVar5->filesize = sVar2;
                  pFVar5->logfilesize = sVar2;
                  pFVar5->writemode = 1;
                  pFVar5->datastart = -1;
                  pFVar5->curbuf = -1;
                  pFVar5->open_count = 1;
                  pFVar5->validcode = 0x22b;
                  pFVar5->noextsyntax = 0;
                  ffldrc(fptr_00,0,1,status_00);
                  iVar4 = *status_00;
                  if (0 < iVar4) {
                    return iVar4;
                  }
                  lVar8 = 0;
                  do {
                    if (*(long *)((long)FptrTable + lVar8) == 0) {
                      *(FITSfile **)((long)FptrTable + lVar8) = (*local_68)->Fptr;
                      return iVar4;
                    }
                    lVar8 = lVar8 + 8;
                  } while (lVar8 != 80000);
                  return iVar4;
                }
                (*driverTable[(int)uVar12].close)(local_6c);
                ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
                ppfVar9 = local_68;
                free((*local_68)->Fptr->headstart);
              }
              free((*ppfVar9)->Fptr->filename);
            }
            free((*ppfVar9)->Fptr);
          }
          free(*ppfVar9);
          *ppfVar9 = (fitsfile *)0x0;
        }
        *status_00 = 0x71;
        return 0x71;
      }
      pcVar10 = "failed to open pre-existing memory file: (ffimem)";
    }
    ffpmsg(pcVar10);
    iVar4 = *status_00;
  }
  return iVar4;
}

Assistant:

int ffimem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */

/*
  Create and initialize a new FITS file in memory
*/
{
    int ii, driver, slen;
    char urltype[MAX_PREFIX_LEN];
    int handle;

    if (*status > 0)
        return(*status);

    *fptr = 0;              /* initialize null file pointer */

    if (need_to_initialize)    {        /* this is called only once */
       *status = fits_init_cfitsio();
    }
    
    if (*status > 0)
        return(*status);

    strcpy(urltype, "memkeep://"); /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffimem)");
        return(*status);
    }

    /* call driver routine to "open" the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize, deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffimem)");
         return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = 32; /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffimem)");
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffimem)");
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, "memfile"); /* dummy filename */
    ((*fptr)->Fptr)->filesize = *buffsize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = *buffsize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = 1;               /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED;  /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */
    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */
    return(*status); 
}